

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall QGraphicsScene::setBspTreeDepth(QGraphicsScene *this,int depth)

{
  QGraphicsSceneBspTreeIndex *this_00;
  long in_FS_OFFSET;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (depth < 0) {
    local_30[0] = '\x02';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    local_30[4] = '\0';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[7] = '\0';
    local_30[8] = '\0';
    local_30[9] = '\0';
    local_30[10] = '\0';
    local_30[0xb] = '\0';
    local_30[0xc] = '\0';
    local_30[0xd] = '\0';
    local_30[0xe] = '\0';
    local_30[0xf] = '\0';
    local_30[0x10] = '\0';
    local_30[0x11] = '\0';
    local_30[0x12] = '\0';
    local_30[0x13] = '\0';
    local_30[0x14] = '\0';
    local_30[0x15] = '\0';
    local_30[0x16] = '\0';
    local_30[0x17] = '\0';
    local_18 = "default";
    QMessageLogger::warning
              (local_30,"QGraphicsScene::setBspTreeDepth: invalid depth %d ignored; must be >= 0",
               depth);
  }
  else {
    this_00 = (QGraphicsSceneBspTreeIndex *)
              QMetaObject::cast((QObject *)&QGraphicsSceneBspTreeIndex::staticMetaObject);
    if (this_00 != (QGraphicsSceneBspTreeIndex *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QGraphicsSceneBspTreeIndex::setBspTreeDepth(this_00,depth);
        return;
      }
      goto LAB_006040f1;
    }
    setBspTreeDepth();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_006040f1:
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::setBspTreeDepth(int depth)
{
    Q_D(QGraphicsScene);
    if (depth < 0) {
        qWarning("QGraphicsScene::setBspTreeDepth: invalid depth %d ignored; must be >= 0", depth);
        return;
    }

    QGraphicsSceneBspTreeIndex *bspTree = qobject_cast<QGraphicsSceneBspTreeIndex *>(d->index);
    if (!bspTree) {
        qWarning("QGraphicsScene::setBspTreeDepth: cannot apply if indexing method is not BSP");
        return;
    }
    bspTree->setBspTreeDepth(depth);
}